

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O2

MXFReader * __thiscall
AS_02::ACES::MXFReader::ReadFrame
          (MXFReader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *Ctx,
          HMACContext *HMAC)

{
  long lVar1;
  char cVar2;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,FrameNum) + 8);
  if (lVar1 != 0) {
    cVar2 = (**(code **)(**(long **)(lVar1 + 0x10) + 0x40))();
    if (cVar2 != '\0') {
      h__Reader::ReadFrame
                ((h__Reader *)this,
                 (ui32_t)*(undefined8 *)(CONCAT44(in_register_00000034,FrameNum) + 8),
                 (FrameBuffer *)((ulong)FrameBuf & 0xffffffff),Ctx,HMAC);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::ReadFrame(ui32_t FrameNum, AS_02::ACES::FrameBuffer &FrameBuf, ASDCP::AESDecContext *Ctx /*= 0*/, ASDCP::HMACContext *HMAC /*= 0*/) const
{

  if(m_Reader && m_Reader->m_File->IsOpen())
    return m_Reader->ReadFrame(FrameNum, FrameBuf, Ctx, HMAC);

  return RESULT_INIT;
}